

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.h
# Opt level: O0

char * __thiscall
btGeneric6DofSpring2Constraint::serialize
          (btGeneric6DofSpring2Constraint *this,void *dataBuffer,btSerializer *serializer)

{
  btTypedConstraint *in_RSI;
  btSerializer *in_RDI;
  bool bVar1;
  int i;
  btGeneric6DofSpring2ConstraintData *dof;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar2;
  
  btTypedConstraint::serialize
            (in_RSI,(void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDI);
  btTransform::serialize
            ((btTransform *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (btTransformFloatData *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  btTransform::serialize
            ((btTransform *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (btTransformFloatData *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  for (iVar2 = 0; iVar2 < 3; iVar2 = iVar2 + 1) {
    (&in_RSI[6].super_btTypedObject)[iVar2].m_objectType =
         *(int *)(in_RDI + (long)iVar2 * 0x58 + 0x3e0);
    *(undefined4 *)((long)&in_RSI[5].m_jointFeedback + (long)iVar2 * 4) =
         *(undefined4 *)(in_RDI + (long)iVar2 * 0x58 + 0x3e4);
    (&in_RSI[6].m_breakingImpulseThreshold)[iVar2] =
         *(btScalar *)(in_RDI + (long)iVar2 * 0x58 + 1000);
    *(undefined4 *)((long)&in_RSI[6].m_rbA + (long)iVar2 * 4) =
         *(undefined4 *)(in_RDI + (long)iVar2 * 0x58 + 0x3ec);
    (&in_RSI[6].m_appliedImpulse)[iVar2] = *(btScalar *)(in_RDI + (long)iVar2 * 0x58 + 0x3f0);
    *(undefined4 *)((long)&in_RSI[7]._vptr_btTypedConstraint + (long)iVar2 * 4) =
         *(undefined4 *)(in_RDI + (long)iVar2 * 0x58 + 0x3f4);
    *(undefined4 *)((long)&in_RSI[7].field_2 + (long)iVar2 * 4) =
         *(undefined4 *)(in_RDI + (long)iVar2 * 0x58 + 0x3f8);
    (&in_RSI[7].m_overrideNumSolverIterations)[iVar2] =
         *(int *)(in_RDI + (long)iVar2 * 0x58 + 0x400);
    *(undefined4 *)((long)&in_RSI[7].m_rbB + (long)iVar2 * 4) =
         *(undefined4 *)(in_RDI + (long)iVar2 * 0x58 + 0x404);
    *(undefined4 *)((long)&in_RSI[7].m_jointFeedback + (long)iVar2 * 4) =
         *(undefined4 *)(in_RDI + (long)iVar2 * 0x58 + 0x40c);
    (&in_RSI[8].super_btTypedObject)[iVar2].m_objectType =
         *(int *)(in_RDI + (long)iVar2 * 0x58 + 0x414);
    (&in_RSI[8].m_breakingImpulseThreshold)[iVar2] =
         *(btScalar *)(in_RDI + (long)iVar2 * 0x58 + 0x41c);
    *(undefined4 *)((long)&in_RSI[8].m_rbA + (long)iVar2 * 4) =
         *(undefined4 *)(in_RDI + (long)iVar2 * 0x58 + 0x424);
  }
  *(undefined4 *)((long)&in_RSI[6].field_2 + 4) = 0;
  *(undefined4 *)((long)&in_RSI[6]._vptr_btTypedConstraint + 4) = 0;
  *(undefined4 *)&in_RSI[6].field_0x24 = 0;
  *(undefined4 *)((long)&in_RSI[6].m_rbB + 4) = 0;
  *(undefined4 *)((long)&in_RSI[6].m_jointFeedback + 4) = 0;
  in_RSI[7].m_userConstraintType = 0;
  in_RSI[7].m_isEnabled = false;
  in_RSI[7].m_needsFeedback = false;
  *(undefined2 *)&in_RSI[7].field_0x1e = 0;
  *(undefined4 *)((long)&in_RSI[7].m_rbA + 4) = 0;
  in_RSI[7].m_dbgDrawSize = 0.0;
  *(undefined4 *)((long)&in_RSI[8]._vptr_btTypedConstraint + 4) = 0;
  *(undefined4 *)((long)&in_RSI[8].field_2 + 4) = 0;
  *(undefined4 *)&in_RSI[8].field_0x24 = 0;
  *(undefined4 *)((long)&in_RSI[8].m_rbB + 4) = 0;
  for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
    if (iVar2 < 3) {
      bVar1 = ((byte)in_RDI[(long)iVar2 * 0x58 + 0x3fc] & 1) != 0;
    }
    else {
      bVar1 = false;
    }
    *(bool *)((long)&in_RSI[8].m_appliedImpulse + (long)iVar2) = bVar1;
    if (iVar2 < 3) {
      bVar1 = ((byte)in_RDI[(long)iVar2 * 0x58 + 0x408] & 1) != 0;
    }
    else {
      bVar1 = false;
    }
    *(bool *)((long)&in_RSI[8].m_dbgDrawSize + (long)iVar2) = bVar1;
    if (iVar2 < 3) {
      bVar1 = ((byte)in_RDI[(long)iVar2 * 0x58 + 0x410] & 1) != 0;
    }
    else {
      bVar1 = false;
    }
    *(bool *)((long)&in_RSI[8].m_jointFeedback + (long)iVar2) = bVar1;
    if (iVar2 < 3) {
      bVar1 = ((byte)in_RDI[(long)iVar2 * 0x58 + 0x418] & 1) != 0;
    }
    else {
      bVar1 = false;
    }
    *(bool *)((long)&in_RSI[8].m_jointFeedback + (long)iVar2 + 4) = bVar1;
    if (iVar2 < 3) {
      bVar1 = ((byte)in_RDI[(long)iVar2 * 0x58 + 0x420] & 1) != 0;
    }
    else {
      bVar1 = false;
    }
    *(bool *)((long)&in_RSI[9]._vptr_btTypedConstraint + (long)iVar2) = bVar1;
  }
  btVector3::serialize
            ((btVector3 *)(in_RDI + 0x2c0),(btVector3FloatData *)&in_RSI[2].m_jointFeedback);
  btVector3::serialize((btVector3 *)(in_RDI + 0x2d0),(btVector3FloatData *)&in_RSI[2].m_rbB);
  btVector3::serialize
            ((btVector3 *)(in_RDI + 0x2e0),(btVector3FloatData *)&in_RSI[3].super_btTypedObject);
  btVector3::serialize
            ((btVector3 *)(in_RDI + 0x2f0),
             (btVector3FloatData *)&in_RSI[3].m_breakingImpulseThreshold);
  btVector3::serialize((btVector3 *)(in_RDI + 0x300),(btVector3FloatData *)&in_RSI[3].m_rbA);
  btVector3::serialize
            ((btVector3 *)(in_RDI + 0x310),(btVector3FloatData *)&in_RSI[3].m_appliedImpulse);
  btVector3::serialize((btVector3 *)(in_RDI + 800),(btVector3FloatData *)(in_RSI + 4));
  btVector3::serialize((btVector3 *)(in_RDI + 900),(btVector3FloatData *)&in_RSI[4].field_2);
  btVector3::serialize
            ((btVector3 *)(in_RDI + 0x394),
             (btVector3FloatData *)&in_RSI[4].m_overrideNumSolverIterations);
  btVector3::serialize((btVector3 *)(in_RDI + 0x33c),(btVector3FloatData *)&in_RSI[4].m_rbB);
  btVector3::serialize
            ((btVector3 *)(in_RDI + 0x34c),(btVector3FloatData *)&in_RSI[4].m_jointFeedback);
  btVector3::serialize
            ((btVector3 *)(in_RDI + 0x360),(btVector3FloatData *)&in_RSI[5].super_btTypedObject);
  btVector3::serialize
            ((btVector3 *)(in_RDI + 0x374),
             (btVector3FloatData *)&in_RSI[5].m_breakingImpulseThreshold);
  for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
    if (iVar2 < 3) {
      bVar1 = ((byte)in_RDI[(long)iVar2 + 0x330] & 1) != 0;
    }
    else {
      bVar1 = false;
    }
    *(bool *)((long)&in_RSI[5].m_rbA + (long)iVar2) = bVar1;
    if (iVar2 < 3) {
      bVar1 = ((byte)in_RDI[(long)iVar2 + 0x333] & 1) != 0;
    }
    else {
      bVar1 = false;
    }
    *(bool *)((long)&in_RSI[5].m_rbA + (long)iVar2 + 4) = bVar1;
    if (iVar2 < 3) {
      bVar1 = ((byte)in_RDI[(long)iVar2 + 0x336] & 1) != 0;
    }
    else {
      bVar1 = false;
    }
    *(bool *)((long)&in_RSI[5].m_rbB + (long)iVar2) = bVar1;
    if (iVar2 < 3) {
      bVar1 = ((byte)in_RDI[(long)iVar2 + 0x35c] & 1) != 0;
    }
    else {
      bVar1 = false;
    }
    *(bool *)((long)&in_RSI[5].m_rbB + (long)iVar2 + 4) = bVar1;
    if (iVar2 < 3) {
      bVar1 = ((byte)in_RDI[(long)iVar2 + 0x370] & 1) != 0;
    }
    else {
      bVar1 = false;
    }
    *(bool *)((long)&in_RSI[5].m_appliedImpulse + (long)iVar2) = bVar1;
  }
  *(undefined4 *)((long)&in_RSI[9]._vptr_btTypedConstraint + 4) = *(undefined4 *)(in_RDI + 0x4e8);
  return "btGeneric6DofSpring2ConstraintData";
}

Assistant:

SIMD_FORCE_INLINE const char* btGeneric6DofSpring2Constraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btGeneric6DofSpring2ConstraintData2* dof = (btGeneric6DofSpring2ConstraintData2*)dataBuffer;
	btTypedConstraint::serialize(&dof->m_typeConstraintData,serializer);

	m_frameInA.serialize(dof->m_rbAFrame);
	m_frameInB.serialize(dof->m_rbBFrame);

	int i;
	for (i=0;i<3;i++)
	{
		dof->m_angularLowerLimit.m_floats[i]       = m_angularLimits[i].m_loLimit;
		dof->m_angularUpperLimit.m_floats[i]       = m_angularLimits[i].m_hiLimit;
		dof->m_angularBounce.m_floats[i]           = m_angularLimits[i].m_bounce;
		dof->m_angularStopERP.m_floats[i]          = m_angularLimits[i].m_stopERP;
		dof->m_angularStopCFM.m_floats[i]          = m_angularLimits[i].m_stopCFM;
		dof->m_angularMotorERP.m_floats[i]         = m_angularLimits[i].m_motorERP;
		dof->m_angularMotorCFM.m_floats[i]         = m_angularLimits[i].m_motorCFM;
		dof->m_angularTargetVelocity.m_floats[i]   = m_angularLimits[i].m_targetVelocity;
		dof->m_angularMaxMotorForce.m_floats[i]    = m_angularLimits[i].m_maxMotorForce;
		dof->m_angularServoTarget.m_floats[i]      = m_angularLimits[i].m_servoTarget;
		dof->m_angularSpringStiffness.m_floats[i]  = m_angularLimits[i].m_springStiffness;
		dof->m_angularSpringDamping.m_floats[i]    = m_angularLimits[i].m_springDamping;
		dof->m_angularEquilibriumPoint.m_floats[i] = m_angularLimits[i].m_equilibriumPoint;
	}
	dof->m_angularLowerLimit.m_floats[3]       = 0;
	dof->m_angularUpperLimit.m_floats[3]       = 0;
	dof->m_angularBounce.m_floats[3]           = 0;
	dof->m_angularStopERP.m_floats[3]          = 0;
	dof->m_angularStopCFM.m_floats[3]          = 0;
	dof->m_angularMotorERP.m_floats[3]         = 0;
	dof->m_angularMotorCFM.m_floats[3]         = 0;
	dof->m_angularTargetVelocity.m_floats[3]   = 0;
	dof->m_angularMaxMotorForce.m_floats[3]    = 0;
	dof->m_angularServoTarget.m_floats[3]      = 0;
	dof->m_angularSpringStiffness.m_floats[3]  = 0;
	dof->m_angularSpringDamping.m_floats[3]    = 0;
	dof->m_angularEquilibriumPoint.m_floats[3] = 0;
	for (i=0;i<4;i++)
	{
		dof->m_angularEnableMotor[i]            = i < 3 ? ( m_angularLimits[i].m_enableMotor ? 1 : 0 ) : 0;
		dof->m_angularServoMotor[i]             = i < 3 ? ( m_angularLimits[i].m_servoMotor ? 1 : 0 ) : 0;
		dof->m_angularEnableSpring[i]           = i < 3 ? ( m_angularLimits[i].m_enableSpring ? 1 : 0 ) : 0;
		dof->m_angularSpringStiffnessLimited[i] = i < 3 ? ( m_angularLimits[i].m_springStiffnessLimited ? 1 : 0 ) : 0;
		dof->m_angularSpringDampingLimited[i]   = i < 3 ? ( m_angularLimits[i].m_springDampingLimited ? 1 : 0 ) : 0;
	}

	m_linearLimits.m_lowerLimit.serialize( dof->m_linearLowerLimit );
	m_linearLimits.m_upperLimit.serialize( dof->m_linearUpperLimit );
	m_linearLimits.m_bounce.serialize( dof->m_linearBounce );
	m_linearLimits.m_stopERP.serialize( dof->m_linearStopERP );
	m_linearLimits.m_stopCFM.serialize( dof->m_linearStopCFM );
	m_linearLimits.m_motorERP.serialize( dof->m_linearMotorERP );
	m_linearLimits.m_motorCFM.serialize( dof->m_linearMotorCFM );
	m_linearLimits.m_targetVelocity.serialize( dof->m_linearTargetVelocity );
	m_linearLimits.m_maxMotorForce.serialize( dof->m_linearMaxMotorForce );
	m_linearLimits.m_servoTarget.serialize( dof->m_linearServoTarget );
	m_linearLimits.m_springStiffness.serialize( dof->m_linearSpringStiffness );
	m_linearLimits.m_springDamping.serialize( dof->m_linearSpringDamping );
	m_linearLimits.m_equilibriumPoint.serialize( dof->m_linearEquilibriumPoint );
	for (i=0;i<4;i++)
	{
		dof->m_linearEnableMotor[i]            = i < 3 ? ( m_linearLimits.m_enableMotor[i] ? 1 : 0 ) : 0;
		dof->m_linearServoMotor[i]             = i < 3 ? ( m_linearLimits.m_servoMotor[i] ? 1 : 0 ) : 0;
		dof->m_linearEnableSpring[i]           = i < 3 ? ( m_linearLimits.m_enableSpring[i] ? 1 : 0 ) : 0;
		dof->m_linearSpringStiffnessLimited[i] = i < 3 ? ( m_linearLimits.m_springStiffnessLimited[i] ? 1 : 0 ) : 0;
		dof->m_linearSpringDampingLimited[i]   = i < 3 ? ( m_linearLimits.m_springDampingLimited[i] ? 1 : 0 ) : 0;
	}

	dof->m_rotateOrder = m_rotateOrder;

	return btGeneric6DofSpring2ConstraintDataName;
}